

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamWriter_p.cpp
# Opt level: O0

void __thiscall BamTools::Internal::BamWriterPrivate::~BamWriterPrivate(BamWriterPrivate *this)

{
  BgzfStream *in_RDI;
  BamWriterPrivate *unaff_retaddr;
  
  Close(unaff_retaddr);
  std::__cxx11::string::~string((string *)&in_RDI[1].m_blockAddress);
  BgzfStream::~BgzfStream(in_RDI);
  return;
}

Assistant:

BamWriterPrivate::~BamWriterPrivate()
{
    Close();
}